

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_blend_bench.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  long in_RSI;
  int in_EDI;
  int i;
  Mode mode;
  Mode in_stack_00000400;
  uint local_14;
  
  local_14 = 0;
  if (1 < in_EDI) {
    lVar2 = strtol(*(char **)(in_RSI + 8),(char **)0x0,10);
    iVar1 = (int)lVar2;
    if (iVar1 == 0) {
      local_14 = 1;
    }
    else if (iVar1 == 1) {
      local_14 = 2;
    }
    else if (iVar1 == 2) {
      local_14 = 3;
    }
  }
  uVar3 = al_install_system(0x5020700,atexit);
  if ((uVar3 & 1) == 0) {
    abort_example("Could not init Allegro\n");
  }
  open_log();
  al_init_image_addon();
  al_init_primitives_addon();
  init_platform_specific();
  display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    abort_example("Error creating display\n");
  }
  if (local_14 == 0) {
    for (local_14 = 1; local_14 < 4; local_14 = local_14 + 1) {
      do_test(in_stack_00000400);
    }
  }
  else {
    do_test(in_stack_00000400);
  }
  al_destroy_display(display);
  close_log(true);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   enum Mode mode = ALL;
   int i;

   if (argc > 1) {
      i = strtol(argv[1], NULL, 10);
      switch (i) {
         case 0:
            mode = PLAIN_BLIT;
            break;
         case 1:
            mode = SCALED_BLIT;
            break;
         case 2:
            mode = ROTATE_BLIT;
            break;
      }
   }

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }

   open_log();

   al_init_image_addon();
   al_init_primitives_addon();
   init_platform_specific();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display\n");
   }
   
   if (mode == ALL) {
      for (mode = PLAIN_BLIT; mode <= ROTATE_BLIT; mode++) {
         do_test(mode);
      }
   }
   else {
      do_test(mode);
   }

   al_destroy_display(display);

   close_log(true);

   return 0;
}